

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  TestContext *testCtx;
  RenderContext *pRVar3;
  _Rb_tree_color _Var4;
  DrawTest *node;
  long *name;
  int iVar5;
  bool bVar6;
  int i;
  uint uVar7;
  deUint32 dVar8;
  deBool dVar9;
  int iVar10;
  CompatibilityTestType CVar11;
  int extraout_EAX;
  long lVar12;
  _Base_ptr p_Var13;
  uint *puVar14;
  _Rb_tree_header *p_Var15;
  int iVar16;
  ulong uVar17;
  deUint32 hash;
  DrawTestSpec spec;
  UniformWeightArray<2> storageWeights;
  UniformWeightArray<3> indexTypeWeights;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  UniformWeightArray<5> drawMethodWeights;
  AttributeSpec attribSpec;
  UniformWeightArray<7> primitiveWeights;
  Random random;
  UniformWeightArray<9> usageWeights;
  UniformWeightArray<11> inputTypeWeights;
  UniformWeightArray<12> outputTypeWeights;
  _Rb_tree_color local_354;
  ulong local_350;
  undefined1 local_348 [56];
  pointer local_310;
  iterator local_308;
  AttributeSpec *local_300;
  DrawTest *local_2f8;
  TestNode *local_2f0;
  long local_2e8;
  float local_2e0 [2];
  RenderContext *local_2d8;
  long *local_2d0;
  long local_2c0 [2];
  float local_2ac [3];
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_2a0;
  float local_26c [5];
  AttributeSpec local_258 [2];
  ios_base local_1e8 [268];
  float local_dc [7];
  deRandom local_c0;
  float local_b0 [9];
  float local_8c [11];
  float local_60 [12];
  
  lVar12 = 0;
  do {
    local_dc[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 7);
  lVar12 = 0;
  do {
    local_26c[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 5);
  lVar12 = 0;
  do {
    local_2ac[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 0;
  do {
    local_2e0[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  lVar12 = 0;
  do {
    local_8c[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xb);
  lVar12 = 0;
  do {
    local_60[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0xc);
  lVar12 = 0;
  do {
    local_b0[lVar12] = 1.0;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 9);
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a0._M_impl.super__Rb_tree_header._M_header;
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar17 = 0;
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2e8 = 0;
  local_2f0 = (TestNode *)this;
  local_2a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a0._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    deRandom_init(&local_c0,(int)uVar17 + 0xc551393);
    uVar7 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&local_c0,init::attribCounts,(int *)init::attribWeights,
                       init::attribWeights);
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_348);
    local_348._0_4_ = 3;
    local_348._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive_const*,float_const*>
                   ((Random *)&local_c0,init::primitives,
                    (Primitive *)"N4deqp5gles310Functional12_GLOBAL__N_110FirstGroupE",local_dc);
    local_348._8_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,init::primitiveCounts,(int *)init::primitiveCountWeights,
                    init::primitiveCountWeights);
    local_348._12_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod_const*,float_const*>
                   ((Random *)&local_c0,init::drawMethods,init::indexTypes,local_26c);
    local_348._16_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType_const*,float_const*>
                   ((Random *)&local_c0,init::indexTypes,init::storages,local_2ac);
    local_348._20_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,init::indexOffsets,(int *)init::indexOffsetWeights,
                    init::indexOffsetWeights);
    local_348._24_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                   ((Random *)&local_c0,init::storages,(Storage *)&DAT_01c568b8,local_2e0);
    local_348._28_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,init::firsts,(int *)init::firstWeights,init::firstWeights);
    local_348._32_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,init::indexMins,init::indexMaxs,init::indexWeights);
    local_348._36_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,init::indexMaxs,(int *)init::indexWeights,init::indexWeights
                   );
    local_348._40_4_ =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&local_c0,init::instanceCounts,(int *)init::instanceWeights,
                    init::instanceWeights);
    bVar6 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_348);
    if (bVar6) {
      local_350 = uVar17;
      if (0 < (int)uVar7) {
        iVar16 = 0;
        do {
          deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(local_258);
          local_258[0].inputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType_const*,float_const*>
                         ((Random *)&local_c0,init::inputTypes,(InputType *)&DAT_01c568ec,local_8c);
          local_258[0].outputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType_const*,float_const*>
                         ((Random *)&local_c0,init::outputTypes,init::usages,local_60);
          local_258[0].storage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                         ((Random *)&local_c0,init::storages,(Storage *)&DAT_01c568b8,local_2e0);
          local_258[0].usage =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage_const*,float_const*>
                         ((Random *)&local_c0,init::usages,init::blacklistedCases,local_b0);
          dVar8 = deRandom_getUint32(&local_c0);
          local_258[0].componentCount = (dVar8 & 3) + 1;
          local_258[0].offset =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_c0,init::offsets,(int *)init::offsetWeights,
                          init::offsetWeights);
          local_258[0].stride =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_c0,init::strides,(int *)init::strideWeights,
                          init::strideWeights);
          dVar9 = deRandom_getBool(&local_c0);
          local_258[0].normalize = dVar9 == 1;
          local_258[0].instanceDivisor =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)&local_c0,init::instanceDivisors,
                          (int *)init::instanceDivisorWeights,init::instanceDivisorWeights);
          dVar9 = deRandom_getBool(&local_c0);
          local_258[0].useDefaultAttribute = dVar9 == 1;
          bVar6 = deqp::gls::DrawTestSpec::AttributeSpec::valid(local_258,(ApiType)local_348._0_4_);
          iVar5 = local_258[0].componentCount;
          if (local_258[0].stride != 0) {
            iVar10 = deqp::gls::DrawTestSpec::inputTypeSize(local_258[0].inputType);
            bVar6 = bVar6 && iVar10 * iVar5 <= local_258[0].stride;
          }
          if (bVar6 != false) {
            if (local_308._M_current == local_300) {
              std::
              vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
              ::_M_realloc_insert<deqp::gls::DrawTestSpec::AttributeSpec_const&>
                        ((vector<deqp::gls::DrawTestSpec::AttributeSpec,std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>>
                          *)&local_310,local_308,local_258);
            }
            else {
              (local_308._M_current)->instanceDivisor = local_258[0].instanceDivisor;
              (local_308._M_current)->useDefaultAttribute = (bool)(char)local_258[0]._36_4_;
              (local_308._M_current)->additionalPositionAttribute =
                   (bool)SUB41(local_258[0]._36_4_,1);
              (local_308._M_current)->bgraComponentOrder = (bool)SUB41(local_258[0]._36_4_,2);
              (local_308._M_current)->field_0x27 = SUB41(local_258[0]._36_4_,3);
              (local_308._M_current)->componentCount = local_258[0].componentCount;
              (local_308._M_current)->offset = local_258[0].offset;
              (local_308._M_current)->stride = local_258[0].stride;
              (local_308._M_current)->normalize = (bool)(char)local_258[0]._28_4_;
              *(int3 *)&(local_308._M_current)->field_0x1d = SUB43(local_258[0]._28_4_,1);
              (local_308._M_current)->inputType = local_258[0].inputType;
              (local_308._M_current)->outputType = local_258[0].outputType;
              (local_308._M_current)->storage = local_258[0].storage;
              (local_308._M_current)->usage = local_258[0].usage;
              local_308._M_current = local_308._M_current + 1;
            }
            iVar16 = iVar16 + 1;
          }
        } while (iVar16 < (int)uVar7);
      }
      if (local_348._4_4_ != PRIMITIVE_POINTS) {
        local_310->instanceDivisor = 0;
      }
      uVar17 = local_350;
      if (((((local_348._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED) ||
            (local_348._4_4_ == PRIMITIVE_POINTS)) || (local_348._32_4_ != local_348._36_4_)) &&
          ((local_348._4_4_ == PRIMITIVE_POINTS || (local_310->useDefaultAttribute == false)))) &&
         ((2 < local_348._4_4_ - PRIMITIVE_TRIANGLES ||
          (((local_310->componentCount != 1 &&
            ((OUTPUTTYPE_UINT < local_310->outputType ||
             ((0x31U >> (local_310->outputType & 0x1f) & 1) == 0)))) &&
           ((local_348._12_4_ != DRAWMETHOD_DRAWELEMENTS_RANGED ||
            (1 < (int)(local_348._36_4_ - local_348._32_4_))))))))) {
        local_354 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_348);
        if (0 < (int)uVar7) {
          lVar12 = 0;
          do {
            _Var4 = local_354;
            local_354 = deqp::gls::DrawTestSpec::AttributeSpec::hash
                                  ((AttributeSpec *)((long)&local_310->inputType + lVar12));
            local_354 = local_354 ^ _Var4 << 2;
            lVar12 = lVar12 + 0x28;
          } while ((ulong)uVar7 * 0x28 != lVar12);
        }
        uVar17 = local_350;
        p_Var1 = &local_2a0._M_impl.super__Rb_tree_header;
        p_Var13 = &p_Var1->_M_header;
        for (p_Var2 = local_2a0._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar6])
        {
          bVar6 = (_Rb_tree_color)*(size_t *)(p_Var2 + 1) < local_354;
          if (!bVar6) {
            p_Var13 = p_Var2;
          }
        }
        p_Var15 = p_Var1;
        if (((_Rb_tree_header *)p_Var13 != p_Var1) &&
           (p_Var15 = (_Rb_tree_header *)p_Var13,
           local_354 < (_Rb_tree_color)((_Rb_tree_header *)p_Var13)->_M_node_count)) {
          p_Var15 = p_Var1;
        }
        if (p_Var15 == p_Var1) {
          CVar11 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_348);
          if (((CVar11 != COMPATIBILITY_UNALIGNED_OFFSET) &&
              (CVar11 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_348),
              CVar11 != COMPATIBILITY_UNALIGNED_STRIDE)) &&
             (puVar14 = std::
                        __find_if<unsigned_int_const*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                  (init::blacklistedCases,&DAT_01c56948,&local_354),
             puVar14 == &DAT_01c56948)) {
            local_2f8 = (DrawTest *)operator_new(0x138);
            testCtx = local_2f0->m_testCtx;
            pRVar3 = ((Context *)local_2f0[1]._vptr_TestNode)->m_renderCtx;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
            std::ostream::_M_insert<unsigned_long>((ulong)local_258);
            std::__cxx11::stringbuf::str();
            local_2d8 = pRVar3;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
            std::ios_base::~ios_base(local_1e8);
            name = local_2d0;
            deqp::gls::DrawTestSpec::getDesc_abi_cxx11_
                      ((string *)local_258,(DrawTestSpec *)local_348);
            node = local_2f8;
            deqp::gls::DrawTest::DrawTest
                      (local_2f8,testCtx,local_2d8,(DrawTestSpec *)local_348,(char *)name,
                       (char *)CONCAT44(local_258[0].outputType,local_258[0].inputType));
            tcu::TestNode::addChild(local_2f0,(TestNode *)node);
            uVar17 = local_350;
            if ((int *)CONCAT44(local_258[0].outputType,local_258[0].inputType) !=
                &local_258[0].componentCount) {
              operator_delete((undefined1 *)CONCAT44(local_258[0].outputType,local_258[0].inputType)
                              ,CONCAT44(local_258[0].offset,local_258[0].componentCount) + 1);
            }
            if (local_2d0 != local_2c0) {
              operator_delete(local_2d0,local_2c0[0] + 1);
            }
          }
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&local_2a0,&local_354);
          local_2e8 = local_2e8 + 1;
        }
      }
    }
    if (local_310 != (pointer)0x0) {
      operator_delete(local_310,(long)local_300 - (long)local_310);
    }
    uVar7 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar7;
  } while (uVar7 != 300);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_2a0);
  return extraout_EAX;
}

Assistant:

void RandomGroup::init (void)
{
	const int			numAttempts				= 300;

	static const int	attribCounts[]			= { 1, 2, 5 };
	static const float	attribWeights[]			= { 30, 10, 1 };
	static const int	primitiveCounts[]		= { 1, 5, 64 };
	static const float	primitiveCountWeights[]	= { 20, 10, 1 };
	static const int	indexOffsets[]			= { 0, 7, 13 };
	static const float	indexOffsetWeights[]	= { 20, 20, 1 };
	static const int	firsts[]				= { 0, 7, 13 };
	static const float	firstWeights[]			= { 20, 20, 1 };
	static const int	instanceCounts[]		= { 1, 2, 16, 17 };
	static const float	instanceWeights[]		= { 20, 10, 5, 1 };
	static const int	indexMins[]				= { 0, 1, 3, 8 };
	static const int	indexMaxs[]				= { 4, 8, 128, 257 };
	static const float	indexWeights[]			= { 50, 50, 50, 50 };
	static const int	offsets[]				= { 0, 1, 5, 12 };
	static const float	offsetWeights[]			= { 50, 10, 10, 10 };
	static const int	strides[]				= { 0, 7, 16, 17 };
	static const float	strideWeights[]			= { 50, 10, 10, 10 };
	static const int	instanceDivisors[]		= { 0, 1, 3, 129 };
	static const float	instanceDivisorWeights[]= { 70, 30, 10, 10 };

	static const gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	static const gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	static const gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	static const gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	static const gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	static const gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	static const gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	static const deUint32 blacklistedCases[]=
	{
		544,	//!< extremely narrow triangle
	};

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only properly aligned and not blacklisted cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET			&&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE			&&
					!de::contains(DE_ARRAY_BEGIN(blacklistedCases), DE_ARRAY_END(blacklistedCases), hash))
				{
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				}
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}